

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t dmrC_alloc_phi(dmr_C *C,basic_block *source,pseudo_t pseudo,symbol *type)

{
  instruction *insn_00;
  instruction *insn;
  symbol *type_local;
  pseudo_t pseudo_local;
  basic_block *source_local;
  dmr_C *C_local;
  
  if (source == (basic_block *)0x0) {
    C_local = (dmr_C *)&C->L->void_pseudo;
  }
  else {
    insn_00 = dmrC_alloc_phisrc(C,pseudo,type);
    insn_00->bb = source;
    dmrC_add_instruction(C,&source->insns,insn_00);
    C_local = (dmr_C *)(insn_00->field_5).target;
  }
  return (pseudo_t)C_local;
}

Assistant:

pseudo_t dmrC_alloc_phi(struct dmr_C *C, struct basic_block *source, pseudo_t pseudo, struct symbol *type)
{
	struct instruction *insn;

	if (!source)
		return VOID_PSEUDO(C);

	insn = dmrC_alloc_phisrc(C, pseudo, type);
	insn->bb = source;
	dmrC_add_instruction(C, &source->insns, insn);
	return insn->target;
}